

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O0

bool __thiscall ON_RenderChannels::operator==(ON_RenderChannels *this,ON_RenderChannels *rch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_wString s2;
  undefined1 local_58 [8];
  ON_wString s1;
  ON_ClassArray<ON_wString> b;
  ON_ClassArray<ON_wString> a;
  ON_RenderChannels *rch_local;
  ON_RenderChannels *this_local;
  
  iVar2 = (*this->_vptr_ON_RenderChannels[5])();
  iVar3 = (*rch->_vptr_ON_RenderChannels[5])();
  if (iVar2 == iVar3) {
    ON_ClassArray<ON_wString>::ON_ClassArray((ON_ClassArray<ON_wString> *)&b.m_count);
    ON_ClassArray<ON_wString>::ON_ClassArray((ON_ClassArray<ON_wString> *)&s1);
    GetSortedCustomListAsString((ON_RenderChannels *)local_58);
    GetSortedCustomListAsString((ON_RenderChannels *)&stack0xffffffffffffff90);
    bVar1 = ::operator!=((ON_wString *)local_58,(ON_wString *)&stack0xffffffffffffff90);
    this_local._7_1_ = !bVar1;
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff90);
    ON_wString::~ON_wString((ON_wString *)local_58);
    ON_ClassArray<ON_wString>::~ON_ClassArray((ON_ClassArray<ON_wString> *)&s1);
    ON_ClassArray<ON_wString>::~ON_ClassArray((ON_ClassArray<ON_wString> *)&b.m_count);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RenderChannels::operator == (const ON_RenderChannels& rch) const
{
  if (Mode() != rch.Mode())
    return false;

  ON_ClassArray<ON_wString> a, b;
  const ON_wString s1 = GetSortedCustomListAsString(*this);
  const ON_wString s2 = GetSortedCustomListAsString(rch);
  if (s1 != s2)
    return false;

  return true;
}